

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_core_module.c
# Opt level: O0

ngx_http_cleanup_t * ngx_http_cleanup_add(ngx_http_request_t *r,size_t size)

{
  ngx_http_request_t *pnVar1;
  ngx_connection_t *pnVar2;
  ngx_http_cleanup_t *cln;
  size_t size_local;
  ngx_http_request_t *r_local;
  
  pnVar1 = r->main;
  r_local = (ngx_http_request_t *)ngx_palloc(pnVar1->pool,0x18);
  if (r_local == (ngx_http_request_t *)0x0) {
    r_local = (ngx_http_request_t *)0x0;
  }
  else {
    if (size == 0) {
      r_local->connection = (ngx_connection_t *)0x0;
    }
    else {
      pnVar2 = (ngx_connection_t *)ngx_palloc(pnVar1->pool,size);
      r_local->connection = pnVar2;
      if (r_local->connection == (ngx_connection_t *)0x0) {
        return (ngx_http_cleanup_t *)0x0;
      }
    }
    *(undefined8 *)r_local = 0;
    r_local->ctx = &pnVar1->cleanup->handler;
    pnVar1->cleanup = (ngx_http_cleanup_t *)r_local;
    if ((pnVar1->connection->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,pnVar1->connection->log,0,"http cleanup add: %p",r_local);
    }
  }
  return (ngx_http_cleanup_t *)r_local;
}

Assistant:

ngx_http_cleanup_t *
ngx_http_cleanup_add(ngx_http_request_t *r, size_t size)
{
    ngx_http_cleanup_t  *cln;

    r = r->main;

    cln = ngx_palloc(r->pool, sizeof(ngx_http_cleanup_t));
    if (cln == NULL) {
        return NULL;
    }

    if (size) {
        cln->data = ngx_palloc(r->pool, size);
        if (cln->data == NULL) {
            return NULL;
        }

    } else {
        cln->data = NULL;
    }

    cln->handler = NULL;
    cln->next = r->cleanup;

    r->cleanup = cln;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http cleanup add: %p", cln);

    return cln;
}